

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_false,_false>::insert_tail_(DaTrie<true,_false,_false> *this,Query *query)

{
  pointer *ppcVar1;
  char cVar2;
  uint uVar3;
  pointer pBVar4;
  iterator iVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  char local_2a;
  char local_29;
  
  if (query->is_finished_ == true) {
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[query->node_pos_] =
         (Bc)((ulong)pBVar4[query->node_pos_] & 0xffffffff00000000 | (ulong)query->value_ |
             0x80000000);
  }
  else {
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[query->node_pos_] =
         (Bc)((ulong)(uint)(*(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start) |
              (ulong)pBVar4[query->node_pos_] & 0xffffffff00000000 | 0x80000000);
    if (query->is_finished_ == false) {
      pcVar6 = query->key_;
      uVar7 = query->pos_;
      do {
        local_29 = pcVar6[uVar7];
        iVar5._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&this->tail_,iVar5,&local_29);
        }
        else {
          *iVar5._M_current = local_29;
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        pcVar6 = query->key_;
        uVar3 = query->pos_;
        uVar7 = uVar3 + 1;
        query->pos_ = uVar7;
        cVar2 = pcVar6[uVar3];
        query->is_finished_ = cVar2 == '\0';
      } while (cVar2 != '\0');
    }
    uVar7 = query->value_;
    lVar8 = 4;
    do {
      local_2a = (char)uVar7;
      iVar5._M_current =
           (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&this->tail_,iVar5,&local_2a);
      }
      else {
        *iVar5._M_current = local_2a;
        ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      uVar7 = uVar7 >> 8;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return;
}

Assistant:

void insert_tail_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    if (query.is_finished()) {
      bc_[query.node_pos()].set_value(query.value());
      return;
    }

    auto tail_pos = tail_size();
    bc_[query.node_pos()].set_value(tail_pos);

    while (!query.is_finished()) {
      tail_.push_back(query.label());
      query.next();
    }

    auto value = query.value();
    for (size_t i = 0; i < sizeof(uint32_t); ++i) {
      tail_.push_back(static_cast<uint8_t>(value & 0xFF));
      value >>= 8;
    }
  }